

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmTarget * __thiscall
cmMakefile::AddUtilityCommand
          (cmMakefile *this,string *utilityName,bool excludeFromAll,
          unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc)

{
  cmCustomCommand *this_00;
  bool bVar1;
  PolicyStatus cmp0116;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  cmCustomCommandLines *commandLines;
  cmTarget *pcVar3;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  cmMakefile *local_98;
  cmTarget *local_90;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_38;
  
  pvVar2 = cmCustomCommand::GetDepends_abi_cxx11_
                     ((cc->_M_t).
                      super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                      .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  local_a0 = cmCustomCommand::GetByproducts_abi_cxx11_
                       ((cc->_M_t).
                        super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                        .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  commandLines = cmCustomCommand::GetCommandLines
                           ((cc->_M_t).
                            super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                            .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  pcVar3 = AddNewUtilityTarget(this,utilityName,excludeFromAll);
  if (((commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((pvVar2->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    bVar1 = ValidateCustomCommand(this,commandLines);
    if (bVar1) {
      CreateGeneratedOutputs(this,local_a0);
      this_00 = (cc->_M_t).
                super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
      cmp0116 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0116,false);
      cmCustomCommand::SetCMP0116Status(this_00,cmp0116);
      local_38._M_head_impl =
           (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
           _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
           super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
      (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl = (cmCustomCommand *)0x0;
      local_88 = (code *)0x0;
      uStack_80 = 0;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_68 = (code *)0x0;
      uStack_60 = 0;
      local_40 = std::
                 _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&,_std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx:1268:5)>
                 ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&,_std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx:1268:5)>
                 ::_M_manager;
      local_a8._M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
      .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
           (_Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)0x0;
      local_98 = this;
      local_90 = pcVar3;
      local_58._M_unused._M_object = this;
      local_58._8_8_ = pcVar3;
      AddGeneratorAction(this,(GeneratorAction *)&local_78);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_38);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,3);
      }
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_a8);
    }
  }
  return pcVar3;
}

Assistant:

cmTarget* cmMakefile::AddUtilityCommand(const std::string& utilityName,
                                        bool excludeFromAll,
                                        std::unique_ptr<cmCustomCommand> cc)
{
  const auto& depends = cc->GetDepends();
  const auto& byproducts = cc->GetByproducts();
  const auto& commandLines = cc->GetCommandLines();
  cmTarget* target = this->AddNewUtilityTarget(utilityName, excludeFromAll);

  // Validate custom commands.
  if ((commandLines.empty() && depends.empty()) ||
      !this->ValidateCustomCommand(commandLines)) {
    return target;
  }

  // Always create the byproduct sources and mark them generated.
  this->CreateGeneratedOutputs(byproducts);

  cc->SetCMP0116Status(this->GetPolicyStatus(cmPolicies::CMP0116));

  // Dispatch command creation to allow generator expressions in outputs.
  this->AddGeneratorAction(
    std::move(cc),
    [=](cmLocalGenerator& lg, const cmListFileBacktrace& lfbt,
        std::unique_ptr<cmCustomCommand> tcc) {
      BacktraceGuard guard(this->Backtrace, lfbt);
      tcc->SetBacktrace(lfbt);
      detail::AddUtilityCommand(lg, cmCommandOrigin::Project, target,
                                std::move(tcc));
    });

  return target;
}